

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::printMessage
          (Comparator<Corrade::TestSuite::Compare::File> *this,ComparisonStatusFlags param_1,
          Debug *out,char *actual,char *expected)

{
  char cVar1;
  char cVar2;
  State *pSVar3;
  Debug *pDVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  unsigned_long uVar8;
  unsigned_long max;
  undefined1 auVar9 [16];
  size_t end;
  size_t i;
  BasicStringView<const_char> local_148;
  StringViewFlags local_138;
  undefined8 local_130;
  undefined8 local_128;
  StringViewFlags local_120;
  BasicStringView<const_char> local_118;
  String local_108;
  undefined8 local_f0;
  undefined8 local_e8;
  String local_e0;
  StringViewFlags local_b8;
  BasicStringView<const_char> local_b0;
  StringViewFlags local_a0;
  undefined8 local_98;
  undefined8 local_90;
  StringViewFlags local_88;
  BasicStringView<const_char> local_80;
  String local_70;
  undefined8 local_58;
  undefined8 local_50;
  String local_48;
  char *local_30;
  char *expected_local;
  char *actual_local;
  Debug *out_local;
  Comparator<Corrade::TestSuite::Compare::File> *this_local;
  ComparisonStatusFlags param_1_local;
  
  local_30 = expected;
  expected_local = actual;
  actual_local = (char *)out;
  out_local = (Debug *)this;
  this_local._7_1_ = param_1._value;
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  if (pSVar3->actualResult == Success) {
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    if (pSVar3->expectedResult == Success) {
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<((Debug *)actual_local,"Files");
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,expected_local);
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"and");
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,local_30);
      Corrade::Utility::Debug::operator<<(pDVar4,"have different");
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      lVar5 = Corrade::Containers::String::size();
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      lVar6 = Corrade::Containers::String::size();
      if (lVar5 == lVar6) {
        Corrade::Utility::Debug::operator<<((Debug *)actual_local,"contents.");
      }
      else {
        pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<((Debug *)actual_local,"size, actual");
        Containers::
        Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
        operator->(&this->_state);
        uVar7 = Corrade::Containers::String::size();
        pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar7);
        pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"but");
        Containers::
        Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
        operator->(&this->_state);
        uVar7 = Corrade::Containers::String::size();
        pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar7);
        Corrade::Utility::Debug::operator<<(pDVar4,"expected.");
      }
      end = 0;
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      uVar8 = Corrade::Containers::String::size();
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      max = Corrade::Containers::String::size();
      uVar8 = Utility::max<unsigned_long>(uVar8,max);
      for (; end != uVar8; end = end + 1) {
        Containers::
        Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
        operator->(&this->_state);
        uVar7 = Corrade::Containers::String::size();
        if (uVar7 <= end) {
LAB_00120384:
          Containers::
          Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
          operator->(&this->_state);
          uVar7 = Corrade::Containers::String::size();
          if (end < uVar7) {
            Containers::
            Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
            operator->(&this->_state);
            uVar7 = Corrade::Containers::String::size();
            if (end < uVar7) {
              pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<
                                          ((Debug *)actual_local,"Actual character");
              pSVar3 = Containers::
                       Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
                       ::operator->(&this->_state);
              auVar9 = Corrade::Containers::String::slice((ulong)&pSVar3->actualContents,end);
              pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<
                                          (pDVar4,auVar9._0_8_,auVar9._8_8_);
              pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"but");
              pSVar3 = Containers::
                       Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
                       ::operator->(&this->_state);
              auVar9 = Corrade::Containers::String::slice((ulong)&pSVar3->expectedContents,end);
              pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<
                                          (pDVar4,auVar9._0_8_,auVar9._8_8_);
              Corrade::Utility::Debug::operator<<(pDVar4,"expected");
            }
            else {
              pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<
                                          ((Debug *)actual_local,"Actual has character");
              pSVar3 = Containers::
                       Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
                       ::operator->(&this->_state);
              auVar9 = Corrade::Containers::String::slice((ulong)&pSVar3->actualContents,end);
              Corrade::Utility::Debug::operator<<(pDVar4,auVar9._0_8_,auVar9._8_8_);
            }
          }
          else {
            pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<
                                        ((Debug *)actual_local,"Expected has character");
            pSVar3 = Containers::
                     Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
                     ::operator->(&this->_state);
            auVar9 = Corrade::Containers::String::slice((ulong)&pSVar3->expectedContents,end);
            Corrade::Utility::Debug::operator<<(pDVar4,auVar9._0_8_,auVar9._8_8_);
          }
          pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<((Debug *)actual_local,"on position")
          ;
          pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,end);
          pDVar4 = Utility::Debug::operator<<(pDVar4,Utility::Debug::nospace);
          Corrade::Utility::Debug::operator<<(pDVar4,".");
          return;
        }
        Containers::
        Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
        operator->(&this->_state);
        uVar7 = Corrade::Containers::String::size();
        if (uVar7 <= end) goto LAB_00120384;
        pSVar3 = Containers::
                 Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
                 operator->(&this->_state);
        cVar1 = Corrade::Containers::String::operator[]((ulong)&pSVar3->actualContents);
        pSVar3 = Containers::
                 Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
                 operator->(&this->_state);
        cVar2 = Corrade::Containers::String::operator[]((ulong)&pSVar3->expectedContents);
        if (cVar1 != cVar2) goto LAB_00120384;
      }
    }
    else {
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<((Debug *)actual_local,"Expected file");
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,local_30);
      Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                (&local_120);
      Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
                (&local_118,"(",local_120);
      pSVar3 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      _ZN7Corrade10Containers15BasicStringViewIKcEC1IS2_TnNSt9enable_ifIXsr3std8is_constIT_EE5valueEiE4typeELi0EEERKNS0_6StringE
                (&local_130,&pSVar3->expectedFilename);
      Corrade::Containers::operator+
                (&local_108,local_118._data,local_118._sizePlusFlags,local_130,local_128);
      Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                (&local_138);
      Containers::BasicStringView<char_const>::
      BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
                ((BasicStringView<char_const> *)&local_f0,&local_108,local_138);
      Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
                ((EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL> *)&i);
      Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
                (&local_148,")",(StringViewFlags)i);
      Corrade::Containers::operator+
                (&local_e0,local_f0,local_e8,local_148._data,local_148._sizePlusFlags);
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,&local_e0);
      Corrade::Utility::Debug::operator<<(pDVar4,"cannot be read.");
      Corrade::Containers::String::~String(&local_e0);
      Corrade::Containers::String::~String(&local_108);
    }
  }
  else {
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<((Debug *)actual_local,"Actual file");
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,expected_local);
    Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
              (&local_88);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_80,"(",local_88);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    _ZN7Corrade10Containers15BasicStringViewIKcEC1IS2_TnNSt9enable_ifIXsr3std8is_constIT_EE5valueEiE4typeELi0EEERKNS0_6StringE
              (&local_98,&pSVar3->actualFilename);
    Corrade::Containers::operator+
              (&local_70,local_80._data,local_80._sizePlusFlags,local_98,local_90);
    Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
              (&local_a0);
    Containers::BasicStringView<char_const>::
    BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
              ((BasicStringView<char_const> *)&local_58,&local_70,local_a0);
    Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
              (&local_b8);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_b0,")",local_b8);
    Corrade::Containers::operator+
              (&local_48,local_58,local_50,local_b0._data,local_b0._sizePlusFlags);
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,&local_48);
    Corrade::Utility::Debug::operator<<(pDVar4,"cannot be read.");
    Corrade::Containers::String::~String(&local_48);
    Corrade::Containers::String::~String(&local_70);
  }
  return;
}

Assistant:

void Comparator<Compare::File>::printMessage(ComparisonStatusFlags, Utility::Debug& out, const char* actual, const char* expected) const {
    if(_state->actualResult != Result::Success) {
        out << "Actual file" << actual << "(" + _state->actualFilename + ")" << "cannot be read.";
        return;
    }

    if(_state->expectedResult != Result::Success) {
        out << "Expected file" << expected << "(" + _state->expectedFilename + ")" << "cannot be read.";
        return;
    }

    out << "Files" << actual << "and" << expected << "have different";
    if(_state->actualContents.size() != _state->expectedContents.size())
        out << "size, actual" << _state->actualContents.size() << "but" << _state->expectedContents.size() << "expected.";
    else
        out << "contents.";

    for(std::size_t i = 0, end = Utility::max(_state->actualContents.size(), _state->expectedContents.size()); i != end; ++i) {
        if(_state->actualContents.size() > i && _state->expectedContents.size() > i && _state->actualContents[i] == _state->expectedContents[i]) continue;

        if(_state->actualContents.size() <= i)
            out << "Expected has character" << _state->expectedContents.slice(i, i + 1);
        else if(_state->expectedContents.size() <= i)
            out << "Actual has character" << _state->actualContents.slice(i, i + 1);
        else
            out << "Actual character" << _state->actualContents.slice(i, i + 1) << "but" << _state->expectedContents.slice(i, i + 1) << "expected";

        out << "on position" << i << Utility::Debug::nospace << ".";
        break;
    }
}